

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::keymap(void)

{
  int iVar1;
  
  if ((attr_map<int,std::function<void(void*,void*,int*)>>::keymap()::m == '\0') &&
     (iVar1 = __cxa_guard_acquire(&attr_map<int,std::function<void(void*,void*,int*)>>::keymap()::m)
     , iVar1 != 0)) {
    keymap::m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keymap::m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    keymap::m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &keymap::m._M_t._M_impl.super__Rb_tree_header._M_header;
    keymap::m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &keymap::m._M_t._M_impl.super__Rb_tree_header._M_header;
    keymap::m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 ~map,&keymap::m,&__dso_handle);
    __cxa_guard_release(&attr_map<int,std::function<void(void*,void*,int*)>>::keymap()::m);
  }
  return &keymap::m;
}

Assistant:

static std::map<K, int>& keymap(){ static std::map<K, int> m; return m; }